

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O0

CURLcode easysrc_add(slist_wc **plist,char *line)

{
  slist_wc *psVar1;
  slist_wc *list;
  CURLcode ret;
  char *line_local;
  slist_wc **plist_local;
  
  list._4_4_ = CURLE_OK;
  psVar1 = slist_wc_append(*plist,line);
  if (psVar1 == (slist_wc *)0x0) {
    easysrc_free();
    list._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    *plist = psVar1;
  }
  return list._4_4_;
}

Assistant:

CURLcode easysrc_add(struct slist_wc **plist, const char *line)
{
  CURLcode ret = CURLE_OK;
  struct slist_wc *list = slist_wc_append(*plist, line);
  if(!list) {
    easysrc_free();
    ret = CURLE_OUT_OF_MEMORY;
  }
  else
    *plist = list;
  return ret;
}